

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

void compress_view(uint8_t *dst,picnic_instance_t *pp,view_t *views,uint idx)

{
  uint uVar1;
  undefined4 in_ECX;
  size_t in_RDX;
  long in_RSI;
  size_t in_RDI;
  uint i_1;
  uint i;
  uint width;
  uint view_round_size;
  view_t *v;
  bitstream_t bs;
  uint num_views;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  mzd_local_t *v_00;
  
  uVar1 = (uint)*(byte *)(in_RSI + 3);
  v_00 = (mzd_local_t *)0x0;
  if (*(char *)(in_RSI + 2) == '\n') {
    if (*(char *)(in_RSI + 2) == '\n') {
      for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
        uint64_to_bitstream_10
                  ((bitstream_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   CONCAT44(in_stack_ffffffffffffffbc,uVar2));
      }
    }
  }
  else {
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      mzd_to_bitstream((bitstream_t *)CONCAT44(in_ECX,uVar1),v_00,in_RDI,in_RDX);
      in_RDX = in_RDX + 0x60;
    }
  }
  return;
}

Assistant:

static void compress_view(uint8_t* dst, const picnic_instance_t* pp, const view_t* views,
                          const unsigned int idx) {
  const unsigned int num_views = pp->lowmc.r;

  bitstream_t bs;
  bs.buffer.w = dst;
  bs.position = 0;

  const view_t* v = &views[0];
#if defined(WITH_LOWMC_129_129_4) || defined(WITH_LOWMC_192_192_4) || defined(WITH_LOWMC_255_255_4)
  if (pp->lowmc.m != 10) {
    const unsigned int view_round_size = pp->lowmc.m * 3;
    const unsigned int width           = (pp->lowmc.n + 63) / 64;

    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      mzd_to_bitstream(&bs, &v->s[idx], width, view_round_size);
    }
    return;
  }
#endif
  // clang-format off
#if defined(WITH_LOWMC_128_128_20) || defined(WITH_LOWMC_192_192_30) || defined(WITH_LOWMC_256_256_38)
  // clang-format on
  if (pp->lowmc.m == 10) {
    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      uint64_to_bitstream_10(&bs, v->t[idx]);
    }
    return;
  }
#endif
  UNREACHABLE;
}